

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.cpp
# Opt level: O1

void __thiscall TrodesMsg::processArg(TrodesMsg *this,char c,binarydata *a)

{
  string *psVar1;
  
  if (c == 'n') {
    CZHelp::zmsg_popNDT(this->msg,a);
    return;
  }
  psVar1 = (string *)__cxa_allocate_exception(0x20);
  *(string **)psVar1 = psVar1 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            (psVar1,"Could not read message. Expected different type, got NDT","");
  __cxa_throw(psVar1,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void TrodesMsg::processArg(const char c, binarydata &a){
    if(c != 'n') throw std::string(PROCESSERROR "NDT");
    CZHelp::zmsg_popNDT(msg, a);
}